

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::toNumber(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  byte c;
  bool bVar1;
  uint Value;
  uint index;
  uint uVar2;
  Cell CVar3;
  Cell numericBase;
  int iVar4;
  ulong uVar5;
  uint Value_00;
  ulong uVar6;
  int local_44;
  
  requireDStackDepth(this,4,">NUMBER");
  this_00 = &this->dStack;
  Value = ForthStack<unsigned_int>::getTop(this_00);
  index = ForthStack<unsigned_int>::getTop(this_00,1);
  uVar2 = ForthStack<unsigned_int>::getTop(this_00,3);
  uVar5 = (ulong)uVar2;
  uVar2 = ForthStack<unsigned_int>::getTop(this_00,2);
  uVar6 = (ulong)uVar2;
  CVar3 = dataSpaceAtCell(this,this->VarOffsetNumericBase);
  local_44 = -0x30;
  do {
    Value_00 = (uint)uVar6;
    uVar2 = (uint)uVar5;
    if (Value == 0) {
      Value = 0;
      break;
    }
    c = dataSpaceAt(this,index);
    numericBase = dataSpaceAtCell(this,this->VarOffsetNumericBase);
    bVar1 = isValidDigit(c,numericBase);
    if (bVar1) {
      iVar4 = local_44;
      if (0x40 < c) {
        iVar4 = -0x37;
      }
      if (0x60 < c) {
        iVar4 = -0x57;
      }
      Value = Value - 1;
      index = index + 1;
      uVar5 = (uVar5 & 0xffffffff | uVar6 << 0x20) * (ulong)CVar3 + (ulong)(iVar4 + (uint)c);
      uVar6 = uVar5 >> 0x20;
    }
    Value_00 = (uint)uVar6;
    uVar2 = (uint)uVar5;
  } while (bVar1);
  ForthStack<unsigned_int>::setTop(this_00,3,uVar2);
  ForthStack<unsigned_int>::setTop(this_00,2,Value_00);
  ForthStack<unsigned_int>::setTop(this_00,1,index);
  ForthStack<unsigned_int>::setTop(this_00,0,Value);
  return;
}

Assistant:

void toNumber(){
			REQUIRE_DSTACK_DEPTH(4, ">NUMBER");
			Cell u1 = dStack.getTop();
			Cell caddr1 = dStack.getTop(1);
			DCell ud1(dStack.getTop(3),dStack.getTop(2));
			DCell base( getNumericBase() );
			while (u1 > 0){
				Char ch = getDataChar(caddr1);

				size_t position{} ;
				if (isValidDigit(ch)){
					position = digitValue(ch);
				} else {
					break;
				}
				--u1; ++caddr1;
				ud1.data_.Dcells = ud1.data_.Dcells * base.data_.Dcells + position;
			}
			dStack.setTop(3, ud1.data_.Cells.lo);
			dStack.setTop(2, ud1.data_.Cells.hi);
			dStack.setTop(1, caddr1);
			dStack.setTop(0, u1);


		}